

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forces_and_moments.cpp
# Opt level: O2

void __thiscall ElasticSupport::addAnEquation(ElasticSupport *this,Balk *balk)

{
  ElasticSupport *pEVar1;
  pointer pdVar2;
  pointer psVar3;
  uint uVar4;
  
  uVar4 = 0;
  Balk::func(balk,0,(double)(this->super_Term).shift * (this->super_Term).segment_length);
  for (psVar3 = (balk->terms).
                super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pEVar1 = (ElasticSupport *)
               (psVar3->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>)._M_ptr, pEVar1 != this
      ; psVar3 = psVar3 + 1) {
    uVar4 = uVar4 + (pEVar1->super_Term).is_unknown;
  }
  if (psVar3 != (balk->terms).
                super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    pdVar2 = (balk->A).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar2[uVar4] = 1.0 / (balk->E * balk->J * this->k) + pdVar2[uVar4];
    return;
  }
  __assert_fail("it != balk.getTerms().end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/maksimkulis[P]balk_cpp/src/forces_and_moments.cpp"
                ,0x6a,"virtual void ElasticSupport::addAnEquation(Balk &) const");
}

Assistant:

void ElasticSupport::addAnEquation(Balk &balk) const
{
    balk.func(0, shift * segment_length);
    int ind_in_A = 0;
    auto it = balk.getTerms().begin();
    while (this != it->get())
    {
        if (it->get()->isUnknown())
        {
            ++ind_in_A;
        }
        ++it;
    }
    assert(it != balk.getTerms().end());
    balk.getA().back()[ind_in_A] += 1 / (k * balk.getEJ());
}